

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O2

int Bac_ManAssignCountNames(Bac_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = 0;
  for (iVar4 = 0; iVar4 < (p->vInputs).nSize; iVar4 = iVar4 + 1) {
    iVar1 = Vec_IntEntry(&p->vInputs,iVar4);
    iVar2 = Bac_ObjBit(p,iVar1);
    if (iVar2 == 0) {
      iVar1 = Bac_ObjNameInt(p,iVar1);
      iVar3 = iVar3 + (uint)(iVar1 == 0);
    }
  }
  for (iVar4 = 0; iVar4 < (p->vType).nSize; iVar4 = iVar4 + 1) {
    iVar2 = Bac_ObjIsBox(p,iVar4);
    iVar1 = iVar4;
    if (iVar2 != 0) {
      while ((iVar1 = iVar1 + 1, iVar1 < (p->vType).nSize &&
             (iVar2 = Bac_ObjIsBo(p,iVar1), iVar2 != 0))) {
        iVar2 = Bac_ObjBit(p,iVar1);
        if (iVar2 == 0) {
          iVar2 = Bac_ObjNameInt(p,iVar1);
          iVar3 = iVar3 + (uint)(iVar2 == 0);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int Bac_ManAssignCountNames( Bac_Ntk_t * p )
{
    int i, iObj, iBox, Count = 0;
    Bac_NtkForEachPiMain( p, iObj, i )
        if ( !Bac_ObjNameInt(p, iObj) )
            Count++;
    Bac_NtkForEachBox( p, iBox )
        Bac_BoxForEachBoMain( p, iBox, iObj, i )
            if ( !Bac_ObjNameInt(p, iObj) )
                Count++;
    return Count;
}